

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O2

void __thiscall
Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::ClearInstanceData
          (TopLevelASBase<Diligent::EngineVkImplTraits> *this)

{
  std::
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->m_Instances)._M_h);
  StringPool::Clear(&this->m_StringPool);
  (this->m_BuildInfo).BindingMode = HIT_GROUP_BINDING_MODE_LAST;
  (this->m_BuildInfo).HitGroupStride = 0;
  (this->m_BuildInfo).FirstContributionToHitGroupIndex = 0xffffffff;
  (this->m_BuildInfo).LastContributionToHitGroupIndex = 0xffffffff;
  return;
}

Assistant:

void ClearInstanceData()
    {
        this->m_Instances.clear();
        this->m_StringPool.Clear();

        this->m_BuildInfo.BindingMode                      = HIT_GROUP_BINDING_MODE_LAST;
        this->m_BuildInfo.HitGroupStride                   = 0;
        this->m_BuildInfo.FirstContributionToHitGroupIndex = INVALID_INDEX;
        this->m_BuildInfo.LastContributionToHitGroupIndex  = INVALID_INDEX;
    }